

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

void cppcms::xss::anon_unknown_8::split_to_parts
               (char *begin,char *end,
               vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
               *tags)

{
  byte bVar1;
  entry *__first;
  entry *__last;
  pointer peVar2;
  html_data_type hVar3;
  char *tmp;
  char *pcVar4;
  pointer __result;
  byte *pbVar5;
  entry *__alloc;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  _Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  *this;
  long lVar9;
  entry local_80;
  byte *local_38;
  
  uVar6 = 0;
  for (pcVar4 = begin; pcVar4 != end; pcVar4 = pcVar4 + 1) {
    uVar6 = uVar6 + (*pcVar4 == '<');
  }
  __first = (tags->
            super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            )._M_impl.super__Vector_impl_data._M_start;
  __last = (tags->
           super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __alloc = __first;
  if (__last != __first) {
    std::
    _Destroy<cppcms::xss::(anonymous_namespace)::entry*,cppcms::xss::(anonymous_namespace)::entry>
              (__first,__last,(allocator<cppcms::xss::(anonymous_namespace)::entry> *)tags);
    (tags->
    super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    )._M_impl.super__Vector_impl_data._M_finish = __first;
    __alloc = (tags->
              super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  this = (_Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
          *)(ulong)uVar6;
  if ((_Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
       *)(((long)(tags->
                 super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__alloc) / 0x48) < this
     ) {
    lVar9 = (long)__first - (long)__alloc;
    __result = std::
               _Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
               ::_M_allocate(this,0x48);
    std::
    vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    ::_S_relocate((tags->
                  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                  )._M_impl.super__Vector_impl_data._M_start,
                  (tags->
                  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                  )._M_impl.super__Vector_impl_data._M_finish,__result,(_Tp_alloc_type *)__alloc);
    peVar2 = (tags->
             super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (peVar2 != (pointer)0x0) {
      operator_delete(peVar2);
    }
    (tags->
    super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    )._M_impl.super__Vector_impl_data._M_start = __result;
    (tags->
    super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)(lVar9 + (long)__result);
    (tags->
    super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this;
  }
  local_38 = (byte *)(end + -1);
  local_80.begin = begin;
  do {
    while( true ) {
      while( true ) {
        if (local_80.begin == end) {
          return;
        }
        bVar1 = *local_80.begin;
        if (bVar1 != 0x3e) break;
        pbVar5 = (byte *)local_80.begin + 1;
        local_80.type = invalid_data;
        local_80.tag.tag_begin = (char *)0x0;
        local_80.tag.tag_end = (char *)0x0;
        local_80.tag.pair = -1;
        local_80.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_80.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_80.end = (char *)pbVar5;
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back(tags,&local_80);
        entry::~entry(&local_80);
        local_80.begin = (char *)pbVar5;
      }
      local_80.end = end;
      if (bVar1 == 0x3c) break;
      if (bVar1 == 0x26) {
        pbVar5 = (byte *)local_80.begin + 1;
        do {
          if (pbVar5 == (byte *)end) {
            local_80.type = invalid_data;
            local_80.tag.tag_begin = (char *)0x0;
            local_80.tag.tag_end = (char *)0x0;
            local_80.tag.pair = -1;
            local_80.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_80.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_80.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            ::push_back(tags,&local_80);
            goto LAB_00246603;
          }
          pbVar8 = pbVar5 + 1;
          bVar1 = *pbVar5;
          pbVar5 = pbVar8;
        } while (bVar1 != 0x3b);
        local_80.type = html_entity;
        local_80.tag.tag_begin = (char *)0x0;
        local_80.tag.tag_end = (char *)0x0;
        local_80.tag.pair = -1;
        local_80.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_80.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_80.end = (char *)pbVar8;
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back(tags,&local_80);
      }
      else {
        pbVar5 = (byte *)local_80.begin + 1;
        do {
          pbVar7 = pbVar5;
          pbVar8 = (byte *)end;
          if (pbVar7 == (byte *)end) break;
          pbVar5 = pbVar7 + 1;
        } while ((0x3e < (ulong)*pbVar7) ||
                (pbVar8 = pbVar7, (0x5000004000000000U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0));
        local_80.type = plain_text;
        local_80.tag.tag_begin = (char *)0x0;
        local_80.tag.tag_end = (char *)0x0;
        local_80.tag.pair = -1;
        local_80.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_80.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_80.end = (char *)pbVar8;
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back(tags,&local_80);
      }
LAB_0024664a:
      entry::~entry(&local_80);
      local_80.begin = (char *)pbVar8;
    }
    pbVar5 = (byte *)local_80.begin + 4;
    if ((((end <= pbVar5) || (((byte *)local_80.begin)[1] != 0x21)) ||
        (((byte *)local_80.begin)[2] != 0x2d)) ||
       (pbVar8 = pbVar5, ((byte *)local_80.begin)[3] != 0x2d)) {
      pbVar5 = (byte *)local_80.begin + 1;
      do {
        if (pbVar5 == (byte *)end) {
          local_80.type = invalid_data;
          local_80.tag.tag_begin = (char *)0x0;
          local_80.tag.tag_end = (char *)0x0;
          local_80.tag.pair = -1;
          local_80.tag.properties.
          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_80.tag.properties.
          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_80.tag.properties.
          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
          ::push_back(tags,&local_80);
          goto LAB_00246603;
        }
        pbVar8 = pbVar5 + 1;
        bVar1 = *pbVar5;
        pbVar5 = pbVar8;
      } while (bVar1 != 0x3e);
      local_80.type = html_tag;
      local_80.tag.tag_begin = (char *)0x0;
      local_80.tag.tag_end = (char *)0x0;
      local_80.tag.pair = -1;
      local_80.tag.properties.
      super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_80.tag.properties.
      super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_80.tag.properties.
      super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_80.end = (char *)pbVar8;
      std::
      vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
      ::push_back(tags,&local_80);
      goto LAB_0024664a;
    }
    for (; (pbVar8 < local_38 && ((*pbVar8 != 0x2d || (pbVar8[1] != 0x2d)))); pbVar8 = pbVar8 + 1) {
    }
    if ((pbVar8 + 2 < end) && (pbVar8[2] == 0x3e)) {
      local_80.type = html_comment;
      for (; pbVar5 < pbVar8; pbVar5 = pbVar5 + 1) {
        bVar1 = *pbVar5;
        if ((0x3e < (ulong)bVar1) ||
           (hVar3 = invalid_data, (0x5000004000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          hVar3 = local_80.type;
        }
        local_80.type = hVar3;
        if ((bVar1 < 0x3f) && ((0x5000004000000000U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))
        break;
      }
      pbVar8 = pbVar8 + 3;
      local_80.tag.tag_begin = (char *)0x0;
      local_80.tag.tag_end = (char *)0x0;
      local_80.tag.pair = -1;
      local_80.tag.properties.
      super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_80.tag.properties.
      super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_80.tag.properties.
      super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_80.end = (char *)pbVar8;
      std::
      vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
      ::push_back(tags,&local_80);
      goto LAB_0024664a;
    }
    local_80.type = invalid_data;
    local_80.tag.tag_begin = (char *)0x0;
    local_80.tag.tag_end = (char *)0x0;
    local_80.tag.pair = -1;
    local_80.tag.properties.
    super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.tag.properties.
    super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.tag.properties.
    super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    ::push_back(tags,&local_80);
LAB_00246603:
    entry::~entry(&local_80);
    local_80.begin = end;
  } while( true );
}

Assistant:

void split_to_parts(char const *begin,char const *end,std::vector<entry> &tags)
		{
			unsigned count = 0;

			for(char const *tmp = begin;tmp!=end;tmp++) {
				if(*tmp == '<')
					count++;
			}
			
			tags.clear();
			tags.reserve(count);

			char const *p=begin;

			while(p!=end) {
				char c=*p;
				switch(c) {
				case '&':
					{
						char const *e=0;
						for(e=p+1;e!=end;e++) {
							if(*e==';')
								break;
						}

						if(e==end) {
							tags.push_back(entry(p,end,invalid_data));
							p=end;
						}
						else {
							tags.push_back(entry(p,e+1,html_entity));
							p=e+1;
						}
					}
					break;

				case '<':

					if(p+4 < end && p[1]=='!' && p[2]=='-' && p[3]=='-') {
						char const *e =p + 4;
						while(e<end-1) {
							if(e[0]=='-' && e[1]=='-') 
								break;
							e++;
						}
						if(e+2<end && e[2]=='>') {
							
							html_data_type type = html_comment;
							
							for(char const *tmp = p+4;tmp<e;tmp++) {
								char c=*tmp;
								///
								/// Prevent IE conditionals
								///
								if(c=='>' || c=='<' || c=='&') {
									type = invalid_data;
									break;
								}
							}

							tags.push_back(entry(p,e+3,type));
							p=e+3;
						}
						else {
							tags.push_back(entry(p,end,invalid_data));
							p=end;
						}

					}
					else {
						char const *e=0;
						for(e=p+1;e!=end;e++) {
							if(*e=='>')
								break;
						}
						if(e==end) {
							tags.push_back(entry(p,end,invalid_data));
							p=end;
						}
						else {
							tags.push_back(entry(p,e+1,html_tag));
							p=e+1;
						}
					}

					break;

				case '>':
					{
						tags.push_back(entry(p,p+1,invalid_data));
						p++;
					}
					break;
				default:
					{
						char const *e=0;
						for(e=p+1;e!=end;e++) {
							char c=*e;
							if(c=='<' || c=='>' || c=='&')
								break;
						}
						tags.push_back(entry(p,e,plain_text));
						p=e;
					}
				} 
			} // while 
		}